

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm.cpp
# Opt level: O0

void __thiscall ncnn::BatchNorm::BatchNorm(BatchNorm *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffc0;
  
  Layer::Layer(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__BatchNorm_001e0a00;
  Mat::Mat((Mat *)(in_RDI + 0x18));
  Mat::Mat((Mat *)(in_RDI + 0x20));
  Mat::Mat((Mat *)(in_RDI + 0x28));
  Mat::Mat((Mat *)(in_RDI + 0x30));
  Mat::Mat((Mat *)(in_RDI + 0x38));
  Mat::Mat((Mat *)(in_RDI + 0x40));
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 1;
  return;
}

Assistant:

BatchNorm::BatchNorm()
{
    one_blob_only = true;
    support_inplace = true;
}